

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::LogAllocSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *this,uint segmentCount,size_t pageCount)

{
  PageMemoryData *pPVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = pageCount * 0x1000;
  this->reservedBytes = this->reservedBytes + lVar2;
  this->committedBytes = this->committedBytes + lVar2;
  this->numberOfSegments = this->numberOfSegments + (ulong)segmentCount;
  pPVar1 = this->memoryData;
  if (pPVar1 != (PageMemoryData *)0x0) {
    pPVar1->allocSegmentCount = pPVar1->allocSegmentCount + (ulong)segmentCount;
    pPVar1->allocSegmentBytes = pPVar1->allocSegmentBytes + lVar2;
    uVar3 = pageCount + pPVar1->currentCommittedPageCount;
    pPVar1->currentCommittedPageCount = uVar3;
    if (uVar3 < pPVar1->peakCommittedPageCount) {
      uVar3 = pPVar1->peakCommittedPageCount;
    }
    pPVar1->peakCommittedPageCount = uVar3;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::LogAllocSegment(uint segmentCount, size_t pageCount)
{
    size_t bytes = pageCount * AutoSystemInfo::PageSize;
    AddReservedBytes(bytes);
    AddCommittedBytes(bytes);
    AddNumberOfSegments(segmentCount);
#ifdef PROFILE_MEM
    if (this->memoryData)
    {
        this->memoryData->allocSegmentCount += segmentCount;
        this->memoryData->allocSegmentBytes += pageCount * AutoSystemInfo::PageSize;

        this->memoryData->currentCommittedPageCount += pageCount;
        this->memoryData->peakCommittedPageCount = max(this->memoryData->peakCommittedPageCount, this->memoryData->currentCommittedPageCount);
    }
#endif
}